

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
JsUtil::
List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Sort(List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
     *this,_func_int_void_ptr_void_ptr_void_ptr *_PtFuncCompare,void *_Context)

{
  size_t count;
  _func_int_void_ptr_void_ptr_void_ptr *local_10;
  _func_int_void_ptr_void_ptr_void_ptr *_PtFuncCompare_local;
  
  count = (size_t)(this->
                  super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>)
                  .count;
  if (count != 0) {
    local_10 = _PtFuncCompare;
    qsort_s<Js::DiagStackFrame*,Js::DiagStackFrame*,Memory::ArenaAllocator,int(*)(void*,void_const*,void_const*)>
              ((this->
               super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
               buffer,count,&local_10,_Context);
  }
  return;
}

Assistant:

void Sort(int(__cdecl * _PtFuncCompare)(void *, const void *, const void *), void *_Context)
        {
            // We can call QSort only if the remove policy for this list is CopyRemovePolicy
            CompileAssert((IsSame<TRemovePolicyType, Js::CopyRemovePolicy<TListType, false> >::IsTrue) ||
                (IsSame<TRemovePolicyType, Js::CopyRemovePolicy<TListType, true> >::IsTrue));
            if (this->count)
            {
                qsort_s<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    this->buffer, this->count, _PtFuncCompare, _Context);
            }
        }